

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

vm_obj_id_t CVmBifTADS::format_datetime_list(time_t timer)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t vVar4;
  tm *ptVar5;
  long in_RDI;
  char buf [80];
  vm_val_t local_98;
  char local_88 [7];
  char local_81 [5];
  char local_7c [5];
  char local_77 [5];
  char local_72 [5];
  char local_6d [5];
  char local_68 [5];
  char local_63 [5];
  char local_5e [38];
  long local_38;
  
  pvVar2 = sp_;
  local_38 = in_RDI;
  ptVar5 = localtime(&local_38);
  local_88[0] = '\t';
  local_88[1] = '\0';
  local_98.val.obj = ptVar5->tm_year + 0x76c;
  local_98.typ = VM_INT;
  vmb_put_dh(local_88 + 2,&local_98);
  local_98.val.obj = ptVar5->tm_mon + 1;
  local_98.typ = VM_INT;
  vmb_put_dh(local_81,&local_98);
  local_98.val.obj = ptVar5->tm_mday;
  local_98.typ = VM_INT;
  vmb_put_dh(local_7c,&local_98);
  local_98.val.obj = ptVar5->tm_wday + 1;
  local_98.typ = VM_INT;
  vmb_put_dh(local_77,&local_98);
  local_98.val.obj = ptVar5->tm_yday + 1;
  local_98.typ = VM_INT;
  vmb_put_dh(local_72,&local_98);
  local_98.val.obj = ptVar5->tm_hour;
  local_98.typ = VM_INT;
  vmb_put_dh(local_6d,&local_98);
  local_98.val.obj = ptVar5->tm_min;
  local_98.typ = VM_INT;
  vmb_put_dh(local_68,&local_98);
  local_98.val.obj = ptVar5->tm_sec;
  local_98.typ = VM_INT;
  vmb_put_dh(local_63,&local_98);
  if (local_38 < 0x80000000) {
    local_98.typ = VM_INT;
    local_98.val.enumval = (uint32_t)local_38;
  }
  else {
    local_98.val.obj =
         CVmObjBigNum::create_int64(0,(uint32_t)((ulong)local_38 >> 0x20),(uint32_t)local_38);
    pvVar3 = sp_;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar3->val).obj = local_98.val.obj;
    local_98.typ = VM_OBJ;
  }
  vmb_put_dh(local_5e,&local_98);
  vVar4 = CVmObjList::create(0,local_88);
  sp_ = pvVar2;
  return vVar4;
}

Assistant:

vm_obj_id_t CVmBifTADS::format_datetime_list(VMG_ os_time_t timer)
{
    /* note the starting stack pointer, so we can discard gc protection */
    vm_val_t *gsp = G_stk->get_sp();
    
    /* convert the time_t to the local time */
    struct tm *tblock = os_localtime(&timer);

    /* start the list buffer - set the length (9 elements) */
    char buf[80];
    vmb_put_len(buf, 9);
    char *dst = buf + VMB_LEN;
    
    /* add the time elements to the list */
    put_list_int(&dst, tblock->tm_year + 1900);
    put_list_int(&dst, tblock->tm_mon + 1);
    put_list_int(&dst, tblock->tm_mday);
    put_list_int(&dst, tblock->tm_wday + 1);
    put_list_int(&dst, tblock->tm_yday + 1);
    put_list_int(&dst, tblock->tm_hour);
    put_list_int(&dst, tblock->tm_min);
    put_list_int(&dst, tblock->tm_sec);

    /* 
     *   if the timer is over 0x7fffffff, we can't represent it as an
     *   int32_t, so store it as a BigNumber value
     */
    if (timer <= 0x7fffffffU)
    {
        /* it'll fit in an ordinary 32-bit signed int */
        put_list_int(&dst, (uint32_t)timer);
    }
    else
    {
        /* it won't fit an int32, so convert to BigNumber */
        vm_obj_id_t bn;
        if (sizeof(timer) <= 4)
        {
            /* os_time_t must be a uint32 */
            bn = CVmObjBigNum::createu(vmg_ FALSE, (ulong)timer, 10);
        }
        else
        {
            /* os_time_t must be 64 bits (or larger) */
            bn = CVmObjBigNum::create_int64(
                vmg_ FALSE, (uint32_t)(timer >> 32),
                (uint32_t)(timer & 0xFFFFFFFF));
        }

        /* save it on the stack for gc protection */
        G_stk->push()->set_obj(bn);
        
        /* add it to the list */
        put_list_obj(&dst, bn);
    }

    /* create a list from the formatted buffer, and return its object ID */
    vm_obj_id_t lst = CVmObjList::create(vmg_ FALSE, buf);

    /* discard gc protection */
    G_stk->set_sp(gsp);

    /* return the list */
    return lst;
}